

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int send_stream_control_frames(quicly_conn_t *conn,quicly_send_context_t *s)

{
  quicly_stream_t *stream;
  uint64_t *puVar1;
  ushort uVar2;
  uint uVar3;
  st_quicly_linklist_t *psVar4;
  st_quicly_linklist_t *psVar5;
  int iVar6;
  int iVar7;
  quicly_sent_t *pqVar8;
  quicly_sent_t *pqVar9;
  long lVar10;
  uint8_t *puVar11;
  st_quicly_linklist_t *psVar12;
  quicly_sent_t *sent;
  quicly_sent_t *sent_1;
  quicly_sent_t *local_58;
  quicly_conn_t *local_50;
  quicly_sent_t *local_48;
  int local_3c;
  st_quicly_linklist_t *local_38;
  
  if ((s->num_datagrams == s->max_datagrams) ||
     (local_38 = &(conn->egress).pending_streams.control, local_50 = conn,
     (conn->egress).pending_streams.control.prev == local_38)) {
    return 0;
  }
  do {
    psVar4 = (conn->egress).pending_streams.control.next;
    stream = (quicly_stream_t *)(psVar4 + -0x10);
    if (*(int *)&psVar4[-4].next == 1) {
      iVar6 = allocate_ack_eliciting_frame(stream->conn,s,0x11,&local_58,on_ack_stop_sending);
      if (iVar6 == 0) {
        (local_58->data).packet.packet_number = (uint64_t)psVar4[-0x10].next;
        *(undefined4 *)&psVar4[-4].next = 2;
        iVar6 = 0;
      }
      if (iVar6 == 0) {
        puVar11 = s->dst;
        psVar12 = psVar4[-0x10].next;
        uVar2 = *(ushort *)((long)&psVar4[-4].next + 4);
        *puVar11 = '\x05';
        pqVar8 = (quicly_sent_t *)(puVar11 + 1);
        if ((st_quicly_linklist_t *)0x3f < psVar12) {
          if (psVar12 < (st_quicly_linklist_t *)0x4000) {
            puVar11[1] = (byte)((ulong)psVar12 >> 8) | 0x40;
            pqVar8 = (quicly_sent_t *)(puVar11 + 2);
          }
          else {
            send_stream_control_frames_cold_1();
            pqVar8 = local_58;
          }
        }
        *(uint8_t *)&pqVar8->acked = (uint8_t)psVar12;
        if (uVar2 < 0x40) {
          puVar11 = (uint8_t *)((long)&pqVar8->acked + 1);
        }
        else if (uVar2 < 0x4000) {
          *(byte *)((long)&pqVar8->acked + 1) = (byte)(uVar2 >> 8) | 0x40;
          puVar11 = (uint8_t *)((long)&pqVar8->acked + 2);
        }
        else {
          *(uint8_t *)((long)&pqVar8->acked + 1) = 0x80;
          puVar11 = (uint8_t *)((long)&pqVar8->acked + 2);
          lVar10 = 0x10;
          do {
            *puVar11 = (uint8_t)(uVar2 >> ((byte)lVar10 & 0x3f));
            puVar11 = puVar11 + 1;
            lVar10 = lVar10 + -8;
          } while (lVar10 != 0);
        }
        *puVar11 = (uint8_t)uVar2;
        s->dst = puVar11 + 1;
        puVar1 = &(stream->conn->super).stats.num_frames_sent.stop_sending;
        *puVar1 = *puVar1 + 1;
        conn = local_50;
        goto LAB_0013188a;
      }
    }
    else {
LAB_0013188a:
      iVar6 = should_send_max_stream_data(stream);
      if (iVar6 != 0) {
        psVar12 = psVar4[-6].prev;
        uVar3 = *(uint *)&psVar4[2].prev;
        iVar6 = allocate_ack_eliciting_frame
                          ((quicly_conn_t *)psVar4[-0x10].prev,s,0x11,&local_48,
                           on_ack_max_stream_data);
        if (iVar6 != 0) goto LAB_00131ace;
        puVar11 = s->dst;
        psVar5 = psVar4[-0x10].next;
        *puVar11 = '\x11';
        pqVar8 = (quicly_sent_t *)(puVar11 + 1);
        local_3c = iVar6;
        if ((st_quicly_linklist_t *)0x3f < psVar5) {
          if (psVar5 < (st_quicly_linklist_t *)0x4000) {
            puVar11[1] = (byte)((ulong)psVar5 >> 8) | 0x40;
            pqVar8 = (quicly_sent_t *)(puVar11 + 2);
          }
          else {
            send_stream_control_frames_cold_2();
            pqVar8 = local_58;
          }
        }
        conn = local_50;
        psVar12 = (st_quicly_linklist_t *)((long)&psVar12->prev + (ulong)uVar3);
        pqVar9 = (quicly_sent_t *)((long)&pqVar8->acked + 1);
        *(uint8_t *)&pqVar8->acked = (uint8_t)psVar5;
        if ((st_quicly_linklist_t *)0x3f < psVar12) {
          if (psVar12 < (st_quicly_linklist_t *)0x4000) {
            *(byte *)((long)&pqVar8->acked + 1) = (byte)((ulong)psVar12 >> 8) | 0x40;
            pqVar9 = (quicly_sent_t *)((long)&pqVar8->acked + 2);
          }
          else {
            send_stream_control_frames_cold_3();
            pqVar9 = local_58;
          }
        }
        *(uint8_t *)&pqVar9->acked = (uint8_t)psVar12;
        s->dst = (uint8_t *)((long)&pqVar9->acked + 1);
        (local_48->data).packet.packet_number = (uint64_t)psVar4[-0x10].next;
        if ((long)psVar12 < (long)psVar4[-3].next) {
          __assert_fail("value >= m->max_committed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/maxsender.h"
                        ,0x69,
                        "void quicly_maxsender_record(quicly_maxsender_t *, int64_t, quicly_maxsender_sent_t *)"
                       );
        }
        psVar4[-3].next = psVar12;
        psVar4[-2].next = (st_quicly_linklist_t *)((long)&(psVar4[-2].next)->prev + 1);
        *(byte *)&psVar4[-1].prev = *(byte *)&psVar4[-1].prev & 0xfe;
        (local_48->data).packet.sent_at = (long)psVar12 * 2 + 1;
        psVar5 = psVar4[-0x10].prev;
        psVar5[0x3d].prev = (st_quicly_linklist_t *)((long)&(psVar5[0x3d].prev)->prev + 1);
        if (psVar5[0x52].prev != (st_quicly_linklist_t *)0x0) {
          (*(code *)psVar5[0x52].prev)
                    (psVar5[0x52].next,
                     "{\"type\":\"max-stream-data-send\", \"time\":%lld, \"stream-id\":%d, \"maximum\":%llu}\n"
                     ,psVar5[0x9c].prev,*(undefined4 *)&psVar4[-0x10].next,psVar12);
        }
      }
      if (*(int *)&psVar4[-3].prev == 1) {
        iVar6 = allocate_ack_eliciting_frame(stream->conn,s,0x19,&local_58,on_ack_reset_stream);
        if (iVar6 == 0) {
          (local_58->data).packet.packet_number = (uint64_t)psVar4[-0x10].next;
          *(undefined4 *)&psVar4[-3].prev = 2;
          iVar6 = 0;
        }
        if (iVar6 != 0) goto LAB_00131ace;
        puVar11 = s->dst;
        psVar12 = psVar4[-0x10].next;
        psVar5 = psVar4[-10].next;
        uVar2 = *(ushort *)((long)&psVar4[-3].prev + 4);
        *puVar11 = '\x04';
        pqVar8 = (quicly_sent_t *)(puVar11 + 1);
        if ((st_quicly_linklist_t *)0x3f < psVar12) {
          if (psVar12 < (st_quicly_linklist_t *)0x4000) {
            puVar11[1] = (byte)((ulong)psVar12 >> 8) | 0x40;
            pqVar8 = (quicly_sent_t *)(puVar11 + 2);
          }
          else {
            send_stream_control_frames_cold_4();
            pqVar8 = local_58;
          }
        }
        conn = local_50;
        *(uint8_t *)&pqVar8->acked = (uint8_t)psVar12;
        if (uVar2 < 0x40) {
          puVar11 = (uint8_t *)((long)&pqVar8->acked + 1);
        }
        else if (uVar2 < 0x4000) {
          *(byte *)((long)&pqVar8->acked + 1) = (byte)(uVar2 >> 8) | 0x40;
          puVar11 = (uint8_t *)((long)&pqVar8->acked + 2);
        }
        else {
          *(uint8_t *)((long)&pqVar8->acked + 1) = 0x80;
          puVar11 = (uint8_t *)((long)&pqVar8->acked + 2);
          lVar10 = 0x10;
          do {
            *puVar11 = (uint8_t)(uVar2 >> ((byte)lVar10 & 0x3f));
            puVar11 = puVar11 + 1;
            lVar10 = lVar10 + -8;
          } while (lVar10 != 0);
        }
        *puVar11 = (uint8_t)uVar2;
        pqVar8 = (quicly_sent_t *)(puVar11 + 1);
        if ((st_quicly_linklist_t *)0x3f < psVar5) {
          if (psVar5 < (st_quicly_linklist_t *)0x4000) {
            puVar11[1] = (byte)((ulong)psVar5 >> 8) | 0x40;
            pqVar8 = (quicly_sent_t *)(puVar11 + 2);
          }
          else {
            send_stream_control_frames_cold_5();
            pqVar8 = local_58;
          }
        }
        *(uint8_t *)&pqVar8->acked = (uint8_t)psVar5;
        s->dst = (uint8_t *)((long)&pqVar8->acked + 1);
        puVar1 = &(stream->conn->super).stats.num_frames_sent.reset_stream;
        *puVar1 = *puVar1 + 1;
      }
      if (*(int *)&psVar4[-1].next == 1) {
        iVar7 = allocate_ack_eliciting_frame
                          (stream->conn,s,0x11,&local_48,on_ack_stream_data_blocked_frame);
        iVar6 = iVar7;
        if (iVar7 == 0) {
          psVar12 = psVar4[-4].prev;
          (local_48->data).packet.packet_number = (uint64_t)psVar4[-0x10].next;
          (local_48->data).ack.range.end = (uint64_t)psVar12;
          puVar11 = s->dst;
          psVar5 = psVar4[-0x10].next;
          *puVar11 = '\x15';
          pqVar8 = (quicly_sent_t *)(puVar11 + 1);
          if ((st_quicly_linklist_t *)0x3f < psVar5) {
            if (psVar5 < (st_quicly_linklist_t *)0x4000) {
              puVar11[1] = (byte)((ulong)psVar5 >> 8) | 0x40;
              pqVar8 = (quicly_sent_t *)(puVar11 + 2);
            }
            else {
              send_stream_control_frames_cold_6();
              pqVar8 = local_58;
            }
          }
          *(uint8_t *)&pqVar8->acked = (uint8_t)psVar5;
          pqVar9 = (quicly_sent_t *)((long)&pqVar8->acked + 1);
          if ((st_quicly_linklist_t *)0x3f < psVar12) {
            if (psVar12 < (st_quicly_linklist_t *)0x4000) {
              *(byte *)((long)&pqVar8->acked + 1) = (byte)((ulong)psVar12 >> 8) | 0x40;
              pqVar9 = (quicly_sent_t *)((long)&pqVar8->acked + 2);
            }
            else {
              send_stream_control_frames_cold_7();
              pqVar9 = local_58;
            }
          }
          *(uint8_t *)&pqVar9->acked = (uint8_t)psVar12;
          s->dst = (uint8_t *)((long)&pqVar9->acked + 1);
          *(undefined4 *)&psVar4[-1].next = 2;
          psVar4[-0x10].prev[0x3f].prev =
               (st_quicly_linklist_t *)((long)&(psVar4[-0x10].prev[0x3f].prev)->prev + 1);
          conn = local_50;
          iVar6 = local_3c;
        }
        if (iVar7 != 0) goto LAB_00131ace;
      }
      iVar6 = 0;
    }
LAB_00131ace:
    if (iVar6 != 0) {
      return iVar6;
    }
    psVar12 = psVar4->prev;
    psVar12->next = psVar4->next;
    psVar4->next->prev = psVar12;
    psVar4->next = psVar4;
    psVar4->prev = psVar4;
    if (s->num_datagrams == s->max_datagrams) {
      return 0;
    }
    if (local_38->prev == local_38) {
      return 0;
    }
  } while( true );
}

Assistant:

static int send_stream_control_frames(quicly_conn_t *conn, quicly_send_context_t *s)
{
    int ret = 0;

    while (s->num_datagrams != s->max_datagrams && quicly_linklist_is_linked(&conn->egress.pending_streams.control)) {
        quicly_stream_t *stream =
            (void *)((char *)conn->egress.pending_streams.control.next - offsetof(quicly_stream_t, _send_aux.pending_link.control));
        if ((ret = send_control_frames_of_stream(stream, s)) != 0)
            goto Exit;
        quicly_linklist_unlink(&stream->_send_aux.pending_link.control);
    }

Exit:
    return ret;
}